

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_encoder.h
# Opt level: O2

void rc_bittree(lzma_range_encoder *rc,probability *probs,uint32_t bit_count,uint32_t symbol)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  sVar1 = rc->count;
  uVar2 = bit_count - 1;
  uVar3 = 1;
  do {
    bVar4 = (symbol >> (uVar2 & 0x1f) & 1) != 0;
    rc->symbols[sVar1] = (uint)bVar4;
    rc->probs[sVar1] = probs + uVar3;
    sVar1 = sVar1 + 1;
    uVar3 = (ulong)((uint)bVar4 + (int)uVar3 * 2);
    bVar4 = uVar2 != 0;
    uVar2 = uVar2 - 1;
  } while (bVar4);
  rc->count = sVar1;
  return;
}

Assistant:

static inline void
rc_bittree(lzma_range_encoder *rc, probability *probs,
		uint32_t bit_count, uint32_t symbol)
{
	uint32_t model_index = 1;

	do {
		const uint32_t bit = (symbol >> --bit_count) & 1;
		rc_bit(rc, &probs[model_index], bit);
		model_index = (model_index << 1) + bit;
	} while (bit_count != 0);
}